

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * bc_str_rstrip(char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    pcVar2 = str + (sVar1 & 0xffffffff);
    lVar4 = (sVar1 & 0xffffffff) - 1;
    do {
      if ((int)(uint)lVar4 < 0) {
        return str;
      }
      pcVar3 = pcVar2;
      if ((0x20 < (ulong)(byte)str[(uint)lVar4 & 0x7fffffff]) ||
         ((0x100003e00U >> ((ulong)(byte)str[(uint)lVar4 & 0x7fffffff] & 0x3f) & 1) == 0)) break;
      pcVar2 = pcVar2 + -1;
      lVar4 = lVar4 + -1;
      pcVar3 = str;
    } while ((int)lVar4 != -1);
    *pcVar3 = '\0';
  }
  return str;
}

Assistant:

char*
bc_str_rstrip(char *str)
{
    if (str == NULL)
        return NULL;
    int i;
    size_t str_len = strlen(str);
    for (i = str_len - 1; i >= 0; i--) {
        if ((str[i] != ' ') && (str[i] != '\t') && (str[i] != '\n') &&
            (str[i] != '\r') && (str[i] != '\t') && (str[i] != '\f') &&
            (str[i] != '\v'))
        {
            str[i + 1] = '\0';
            break;
        }
        if (i == 0) {
            str[0] = '\0';
            break;
        }
    }
    return str;
}